

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O0

void __thiscall
Centaurus::ChaserEM64T<unsigned_char>::~ChaserEM64T(ChaserEM64T<unsigned_char> *this)

{
  ChaserEM64T<unsigned_char> *this_00;
  ChaserEM64T<unsigned_char> *this_local;
  
  (this->super_IChaser)._vptr_IChaser = (_func_int **)&PTR__ChaserEM64T_00312928;
  this_00 = this;
  std::vector<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>::
  ~vector(&this->m_funcarray);
  std::
  unordered_map<Centaurus::Identifier,_void_*(*)(void_*,_const_void_*),_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_void_*(*)(void_*,_const_void_*)>_>_>
  ::~unordered_map(&this->m_funcmap);
  asmjit::CodeHolder::~CodeHolder((CodeHolder *)this);
  asmjit::JitRuntime::~JitRuntime((JitRuntime *)this_00);
  IChaser::~IChaser(&this->super_IChaser);
  return;
}

Assistant:

virtual ~ChaserEM64T() {}